

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::AddPath
          (LocationRecorder *this,int path_component)

{
  SourceCodeInfo_Location::_internal_add_path(this->location_,path_component);
  return;
}

Assistant:

void Parser::LocationRecorder::AddPath(int path_component) {
  location_->add_path(path_component);
}